

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O0

ggml_threadpool *
ggml_threadpool_new_impl(ggml_threadpool_params *tpp,ggml_cgraph *cgraph,ggml_cplan *cplan)

{
  _Bool _Var1;
  int iVar2;
  pthread_mutex_t *__mutex;
  _Bool *__n;
  void *__s;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  int32_t rc;
  int j_1;
  int32_t cpumask_iter;
  int j;
  ggml_compute_state *workers;
  size_t workers_size;
  ggml_threadpool *threadpool;
  _Bool *in_stack_00000068;
  int local_3c;
  undefined4 uVar3;
  int iVar4;
  
  __mutex = (pthread_mutex_t *)ggml_aligned_malloc(0x140);
  *(undefined8 *)((long)__mutex + 0x58) = in_RSI;
  *(undefined8 *)((long)__mutex + 0x60) = in_RDX;
  LOCK();
  *(undefined4 *)((long)__mutex + 0x68) = 0;
  UNLOCK();
  LOCK();
  *(undefined4 *)((long)__mutex + 0x80) = 0;
  UNLOCK();
  LOCK();
  *(undefined4 *)((long)__mutex + 0xc0) = 0;
  UNLOCK();
  LOCK();
  *(undefined4 *)((long)__mutex + 0x100) = 0;
  UNLOCK();
  LOCK();
  *(undefined1 *)((long)__mutex + 0x104) = 0;
  UNLOCK();
  LOCK();
  *(byte *)((long)__mutex + 0x105) = *(byte *)(in_RDI + 0x20d) & 1;
  UNLOCK();
  LOCK();
  *(undefined4 *)((long)__mutex + 0x108) = 0xffffffff;
  UNLOCK();
  *(undefined8 *)((long)__mutex + 0x110) = 0;
  __mutex[7].__data.__lock = *(int *)(in_RDI + 0x200);
  LOCK();
  *(undefined4 *)((long)__mutex + 0x11c) = *(undefined4 *)(in_RDI + 0x200);
  UNLOCK();
  *(undefined4 *)((long)__mutex + 0x124) = *(undefined4 *)(in_RDI + 0x208);
  *(undefined4 *)((long)__mutex + 0x120) = *(undefined4 *)(in_RDI + 0x204);
  *(undefined4 *)((long)__mutex + 0x128) = 0;
  __n = (_Bool *)((long)*(int *)(in_RDI + 0x200) * 0x220);
  __s = (void *)ggml_aligned_malloc(__n);
  memset(__s,0,(size_t)__n);
  for (iVar4 = 0; iVar4 < *(int *)(in_RDI + 0x200); iVar4 = iVar4 + 1) {
    *(pthread_mutex_t **)((long)__s + (long)iVar4 * 0x220 + 0x210) = __mutex;
    *(int *)((long)__s + (long)iVar4 * 0x220 + 0x218) = iVar4;
  }
  *(void **)((long)__mutex + 0x110) = __s;
  pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)(__mutex + 1),(pthread_condattr_t *)0x0);
  uVar3 = 0;
  for (local_3c = 1; _Var1 = SUB81((ulong)__s >> 0x38,0), local_3c < *(int *)(in_RDI + 0x200);
      local_3c = local_3c + 1) {
    ggml_thread_cpumask_next((_Bool *)__mutex->__size,__n,_Var1,(int32_t *)CONCAT44(iVar4,uVar3));
    iVar2 = pthread_create((pthread_t *)((long)__s + (long)local_3c * 0x220),(pthread_attr_t *)0x0,
                           ggml_graph_compute_secondary_thread,
                           (void *)((long)__s + (long)local_3c * 0x220));
    if (iVar2 != 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu.c"
                 ,0xbfe,"GGML_ASSERT(%s) failed","rc == 0");
    }
  }
  ggml_thread_cpumask_next((_Bool *)__mutex->__size,__n,_Var1,(int32_t *)CONCAT44(iVar4,uVar3));
  if ((*(atomic_bool *)((long)__mutex + 0x105) & 1U) == 0) {
    ggml_thread_apply_priority((int32_t)__mutex);
    _Var1 = ggml_thread_cpumask_is_valid((*(ggml_compute_state **)((long)__mutex + 0x110))->cpumask)
    ;
    if (_Var1) {
      ggml_thread_apply_affinity(in_stack_00000068);
    }
  }
  return (ggml_threadpool *)__mutex;
}

Assistant:

static struct ggml_threadpool * ggml_threadpool_new_impl(
    struct ggml_threadpool_params * tpp,
               struct ggml_cgraph * cgraph,
                struct ggml_cplan * cplan) {

    struct ggml_threadpool * threadpool =
        ggml_aligned_malloc(sizeof(struct ggml_threadpool));
    {
        threadpool->cgraph           = cgraph;
        threadpool->cplan            = cplan;
        threadpool->n_graph          = 0;
        threadpool->n_barrier        = 0;
        threadpool->n_barrier_passed = 0;
        threadpool->current_chunk    = 0;
        threadpool->stop             = false;
        threadpool->pause            = tpp->paused;
        threadpool->abort            = -1;
        threadpool->workers          = NULL;
        threadpool->n_threads_max    = tpp->n_threads;
        threadpool->n_threads_cur    = tpp->n_threads;
        threadpool->poll             = tpp->poll;
        threadpool->prio             = tpp->prio;
        threadpool->ec               = GGML_STATUS_SUCCESS;
    }

    // Allocate and init workers state
    const size_t workers_size = sizeof(struct ggml_compute_state) * tpp->n_threads;
    struct ggml_compute_state * workers = ggml_aligned_malloc(workers_size);

    memset(workers, 0, workers_size);
    for (int j = 0; j < tpp->n_threads; j++) {
        workers[j].threadpool = threadpool;
        workers[j].ith        = j;
    }

    threadpool->workers = workers;

#ifndef GGML_USE_OPENMP
    ggml_mutex_init(&threadpool->mutex);
    ggml_cond_init(&threadpool->cond);

    // Spin the threads for all workers, and update CPU placements.
    // Place the main thread last (towards the higher numbered CPU cores).

    int32_t cpumask_iter = 0;

    for (int j = 1; j < tpp->n_threads; j++) {
        ggml_thread_cpumask_next(tpp->cpumask, workers[j].cpumask, tpp->strict_cpu, &cpumask_iter);

        int32_t rc = ggml_thread_create(&workers[j].thrd, NULL, ggml_graph_compute_secondary_thread, &workers[j]);
        GGML_ASSERT(rc == 0);
    }

    ggml_thread_cpumask_next(tpp->cpumask, workers[0].cpumask, tpp->strict_cpu, &cpumask_iter);

    if (!threadpool->pause) {
        // Update main thread prio and affinity at the start, otherwise we'll do it in resume
        ggml_thread_apply_priority(threadpool->prio);
        if (ggml_thread_cpumask_is_valid(threadpool->workers[0].cpumask)) {
            ggml_thread_apply_affinity(threadpool->workers[0].cpumask);
        }
    }
#endif // GGML_USE_OPENMP

    return threadpool;
}